

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

_Bool match_column(ecs_world_t *world,ecs_type_t type,ecs_sig_from_kind_t from_kind,
                  ecs_entity_t component,ecs_entity_t source,ecs_match_failure_t *failure_info)

{
  _Bool _Var1;
  ecs_entity_t eVar2;
  ecs_type_t type_00;
  _Bool local_49;
  ecs_type_t source_type;
  ecs_match_failure_t *failure_info_local;
  ecs_entity_t source_local;
  ecs_entity_t component_local;
  ecs_sig_from_kind_t from_kind_local;
  ecs_type_t type_local;
  ecs_world_t *world_local;
  
  if (from_kind == EcsFromAny) {
    failure_info->reason = EcsMatchFromSelf;
    world_local._7_1_ = ecs_type_has_entity(world,type,component);
  }
  else if (from_kind == EcsFromOwned) {
    failure_info->reason = EcsMatchFromOwned;
    world_local._7_1_ = ecs_type_owns_entity(world,type,component,true);
  }
  else if (from_kind == EcsFromShared) {
    failure_info->reason = EcsMatchFromShared;
    _Var1 = ecs_type_owns_entity(world,type,component,true);
    local_49 = false;
    if (!_Var1) {
      local_49 = ecs_type_owns_entity(world,type,component,false);
    }
    world_local._7_1_ = local_49;
  }
  else if (from_kind == EcsFromParent) {
    failure_info->reason = EcsMatchFromContainer;
    eVar2 = ecs_find_in_type(world,type,component,0xfd00000000000000);
    world_local._7_1_ = eVar2 != 0;
  }
  else if (from_kind == EcsFromEntity) {
    failure_info->reason = EcsMatchFromEntity;
    type_00 = ecs_get_type(world,source);
    world_local._7_1_ = ecs_type_has_entity(world,type_00,component);
  }
  else {
    world_local._7_1_ = true;
  }
  return world_local._7_1_;
}

Assistant:

static
bool match_column(
    ecs_world_t *world,
    ecs_type_t type,
    ecs_sig_from_kind_t from_kind,
    ecs_entity_t component,
    ecs_entity_t source,
    ecs_match_failure_t *failure_info)
{
    if (from_kind == EcsFromAny) {
        failure_info->reason = EcsMatchFromSelf;
        return ecs_type_has_entity(world, type, component);
        
    } else if (from_kind == EcsFromOwned) {
        failure_info->reason = EcsMatchFromOwned;
        return ecs_type_owns_entity(world, type, component, true);

    } else if (from_kind == EcsFromShared) {
        failure_info->reason = EcsMatchFromShared;
        return !ecs_type_owns_entity(world, type, component, true) &&
            ecs_type_owns_entity(world, type, component, false);

    } else if (from_kind == EcsFromParent) {
        failure_info->reason = EcsMatchFromContainer;
        return ecs_find_in_type(world, type, component, ECS_CHILDOF) != 0;

    } else if (from_kind == EcsFromEntity) {
        failure_info->reason = EcsMatchFromEntity;
        ecs_type_t source_type = ecs_get_type(world, source);
        return ecs_type_has_entity(world, source_type, component);
    } else {
        return true;
    }
}